

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O0

int pnm_maxvaltodepth(uint_fast32_t maxval)

{
  undefined4 local_14;
  uint_fast32_t uStack_10;
  int n;
  uint_fast32_t maxval_local;
  
  local_14 = 0;
  for (uStack_10 = maxval; uStack_10 != 0; uStack_10 = uStack_10 >> 1) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int pnm_maxvaltodepth(uint_fast32_t maxval)
{
	int n;

	n = 0;
	while (maxval > 0) {
		maxval >>= 1;
		++n;
	}
	return n;
}